

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdKelvinFdBeginPatchC::is_valid_val(MthdKelvinFdBeginPatchC *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  bVar2 = true;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar3 = uVar1 >> 0x10 & 0x1f;
    if (((ulong)uVar3 - 0x12 < 0xfffffffffffffff2) || (uVar3 <= (uVar1 >> 0x15 & 0x1f))) {
      return false;
    }
    bVar2 = -1 < (int)uVar1 && (uVar1 >> 0x1a & 0x1f) < uVar3;
  }
  return bVar2;
}

Assistant:

bool is_valid_val() override {
		if (chipset.card_type != 0x20)
			return true;
		if (extr(val, 16, 5) < 4)
			return false;
		if (extr(val, 16, 5) > 0x11)
			return false;
		if (extr(val, 21, 5) >= extr(val, 16, 5))
			return false;
		if (extr(val, 26, 5) >= extr(val, 16, 5))
			return false;
		if (extr(val, 31, 1))
			return false;
		return true;
	}